

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O3

string * CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_Name_abi_cxx11_
                   (VisionFeaturePrint_Scene_SceneVersion value)

{
  int iVar1;
  string *psVar2;
  
  if (VisionFeaturePrint_Scene_SceneVersion_Name[abi:cxx11](CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion)
      ::dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&VisionFeaturePrint_Scene_SceneVersion_Name[abi:cxx11](CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion)
                                 ::dummy);
    if (iVar1 != 0) {
      VisionFeaturePrint_Scene_SceneVersion_Name::dummy =
           google::protobuf::internal::InitializeEnumStrings
                     ((EnumEntry *)VisionFeaturePrint_Scene_SceneVersion_entries,
                      (int *)VisionFeaturePrint_Scene_SceneVersion_entries_by_number,3,
                      (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)VisionFeaturePrint_Scene_SceneVersion_strings_abi_cxx11_);
      __cxa_guard_release(&VisionFeaturePrint_Scene_SceneVersion_Name[abi:cxx11](CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion)
                           ::dummy);
    }
  }
  iVar1 = google::protobuf::internal::LookUpEnumName
                    ((EnumEntry *)VisionFeaturePrint_Scene_SceneVersion_entries,
                     (int *)VisionFeaturePrint_Scene_SceneVersion_entries_by_number,3,value);
  if (iVar1 == -1) {
    psVar2 = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
      google::protobuf::internal::InitProtobufDefaultsSlow();
    }
  }
  else {
    psVar2 = (string *)
             (VisionFeaturePrint_Scene_SceneVersion_strings_abi_cxx11_ + (long)iVar1 * 0x20);
  }
  return psVar2;
}

Assistant:

const std::string& VisionFeaturePrint_Scene_SceneVersion_Name(
    VisionFeaturePrint_Scene_SceneVersion value) {
  static const bool dummy =
      ::PROTOBUF_NAMESPACE_ID::internal::InitializeEnumStrings(
          VisionFeaturePrint_Scene_SceneVersion_entries,
          VisionFeaturePrint_Scene_SceneVersion_entries_by_number,
          3, VisionFeaturePrint_Scene_SceneVersion_strings);
  (void) dummy;
  int idx = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumName(
      VisionFeaturePrint_Scene_SceneVersion_entries,
      VisionFeaturePrint_Scene_SceneVersion_entries_by_number,
      3, value);
  return idx == -1 ? ::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString() :
                     VisionFeaturePrint_Scene_SceneVersion_strings[idx].get();
}